

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cc
# Opt level: O3

void RigidBodyDynamics::InverseDynamicsConstraints
               (Model *model,VectorNd *Q,VectorNd *QDot,VectorNd *QDDotDesired,ConstraintSet *CS,
               VectorNd *QDDotOutput,VectorNd *TauOutput,bool update_kinematics,
               vector<SpatialVector_t,_std::allocator<SpatialVector_t>_> *f_ext)

{
  ConstraintSet *pCVar1;
  double **ppdVar2;
  undefined8 *puVar3;
  double *pdVar4;
  ulong uVar5;
  double *pdVar6;
  Index IVar7;
  double dVar8;
  double *pdVar9;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pPVar10;
  undefined8 uVar11;
  ConstraintSet *pCVar12;
  ConstraintSet *pCVar13;
  VectorNd *pVVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  ActualDstType actualDst;
  ConstraintSet *pCVar18;
  VectorNd *pVVar19;
  assign_op<double,_double> local_121;
  MatrixNd local_120;
  ConstraintSet *local_108;
  ConstraintSet *local_100;
  ConstraintSet *local_f8;
  ConstraintSet *local_f0;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_e8;
  ConstraintSet *local_d8;
  ConstraintSet *local_d0;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *local_c8;
  ConstraintSet *local_c0;
  undefined1 local_b8 [16];
  RhsNested local_a8;
  ConstraintSet *local_a0;
  ConstraintSet *local_98;
  ConstraintSet *local_90;
  ConstraintSet *local_88;
  ConstraintSet *local_80;
  ConstraintSet *local_78;
  ConstraintSet *local_70;
  ConstraintSet *local_68;
  ConstraintSet *local_58;
  ConstraintSet *local_50;
  ConstraintSet *local_38;
  
  pCVar1 = CS + 0x160;
  pCVar12 = CS + 0x1e8;
  lVar17 = (TauOutput->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
           m_rows;
  local_108 = (ConstraintSet *)QDDotDesired;
  local_100 = pCVar12;
  local_c8 = &QDDotOutput->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>;
  if (0 < lVar17) {
    memset((TauOutput->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
           m_data,0,lVar17 << 3);
  }
  CalcConstrainedSystemVariables(model,Q,QDot,(VectorNd *)pCVar12,CS,update_kinematics,f_ext);
  pCVar18 = local_100;
  local_b8._0_8_ = local_100;
  local_a8.m_matrix = (non_const_type)local_100;
  local_d0 = CS + 0x290;
  local_b8._8_8_ = pCVar1;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Product<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>,Eigen::internal::assign_op<double,double>>
            ((Matrix<double,__1,__1,_0,__1,__1> *)local_d0,
             (Product<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
              *)local_b8,(assign_op<double,_double> *)&local_120,(type)0x0);
  pCVar12 = CS + 0x200;
  local_b8._0_8_ = pCVar18;
  local_d8 = CS + 0x2a8;
  local_b8._8_8_ = pCVar1;
  local_a8.m_matrix = (non_const_type)pCVar12;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Product<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>,Eigen::internal::assign_op<double,double>>
            ((Matrix<double,__1,__1,_0,__1,__1> *)local_d8,
             (Product<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
              *)local_b8,(assign_op<double,_double> *)&local_120,(type)0x0);
  local_a8.m_matrix = (non_const_type)pCVar18;
  local_c0 = CS + 0x2c0;
  local_b8._0_8_ = pCVar12;
  local_b8._8_8_ = pCVar1;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Product<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>,Eigen::internal::assign_op<double,double>>
            ((Matrix<double,__1,__1,_0,__1,__1> *)local_c0,
             (Product<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
              *)local_b8,(assign_op<double,_double> *)&local_120,(type)0x0);
  local_b8._0_8_ = pCVar12;
  local_b8._8_8_ = pCVar1;
  local_a8.m_matrix = (non_const_type)pCVar12;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Product<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>,Eigen::internal::assign_op<double,double>>
            ((Matrix<double,__1,__1,_0,__1,__1> *)(CS + 0x2d8),
             (Product<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
              *)local_b8,(assign_op<double,_double> *)&local_120,(type)0x0);
  local_b8._0_8_ = pCVar18;
  local_f0 = CS + 0x308;
  local_b8._8_8_ = CS + 0x198;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>,Eigen::internal::assign_op<double,double>>
            ((Matrix<double,__1,__1,_0,__1,__1> *)local_f0,
             (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
              *)local_b8,(assign_op<double,_double> *)&local_120,(type)0x0);
  pCVar1 = CS + 800;
  local_f8 = pCVar12;
  local_b8._0_8_ = pCVar12;
  local_b8._8_8_ = CS + 0x198;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>,Eigen::internal::assign_op<double,double>>
            ((Matrix<double,__1,__1,_0,__1,__1> *)pCVar1,
             (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
              *)local_b8,(assign_op<double,_double> *)&local_120,(type)0x0);
  local_120.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)pCVar18;
  local_120.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
       (Index)local_108;
  pCVar12 = CS + 600;
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
            ((Matrix<double,_1,1,0,_1,1> *)local_b8,
             (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>
              *)&local_120);
  uVar11 = local_b8._0_8_;
  pCVar18 = (ConstraintSet *)local_b8._8_8_;
  if (*(ConstraintSet **)(CS + 0x260) != (ConstraintSet *)local_b8._8_8_) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)pCVar12,local_b8._8_8_,1)
    ;
    pCVar18 = *(ConstraintSet **)(CS + 0x260);
  }
  lVar17 = *(long *)pCVar12;
  pCVar13 = (ConstraintSet *)((long)pCVar18 - ((long)pCVar18 >> 0x3f) & 0xfffffffffffffffe);
  if (1 < (long)pCVar18) {
    lVar15 = 0;
    do {
      ppdVar2 = &(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)uVar11)->m_storage)
                 .m_data + lVar15;
      IVar7 = (Index)ppdVar2[1];
      puVar3 = (undefined8 *)(lVar17 + lVar15 * 8);
      *puVar3 = *ppdVar2;
      puVar3[1] = IVar7;
      lVar15 = lVar15 + 2;
    } while (lVar15 < (long)pCVar13);
  }
  if ((long)pCVar13 < (long)pCVar18) {
    do {
      *(double **)(lVar17 + (long)pCVar13 * 8) =
           (&(((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)uVar11)->m_storage).
             m_data)[(long)pCVar13];
      pCVar13 = pCVar13 + 1;
    } while (pCVar18 != pCVar13);
  }
  free((void *)local_b8._0_8_);
  local_38 = pCVar1;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_120,
             (DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)&local_38);
  local_b8._0_8_ = CS + 0x188;
  local_b8._8_8_ = local_f0;
  local_e8.m_storage.m_data = (double *)0x0;
  local_e8.m_storage.m_rows = 0;
  local_a8.m_matrix = (non_const_type)pCVar12;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&local_e8,*(Index *)(CS + 0x318),1);
  Eigen::internal::
  assignment_from_xpr_op_product<Eigen::Matrix<double,-1,1,0,-1,1>,Eigen::Matrix<double,-1,1,0,-1,1>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,-1,-1,0,-1,-1>>,Eigen::Matrix<double,-1,1,0,-1,1>,0>,Eigen::internal::assign_op<double,double>,Eigen::internal::sub_assign_op<double,double>>
  ::
  run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const>,Eigen::internal::assign_op<double,double>>
            ((Matrix<double,__1,_1,_0,__1,_1> *)&local_e8,
             (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
              *)local_b8,&local_121);
  pCVar18 = CS + 0x268;
  SolveLinearSystem(&local_120,(VectorNd *)&local_e8,(VectorNd *)pCVar18,*(LinearSolver *)CS);
  free(local_e8.m_storage.m_data);
  free(local_120.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  local_108 = CS + 0x178;
  local_a8.m_matrix = (non_const_type)local_f8;
  local_90 = local_c0;
  local_98 = local_108;
  local_88 = pCVar12;
  local_78 = CS + 0x2d8;
  local_70 = pCVar18;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const>const,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_120,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>_>
              *)local_b8);
  pCVar13 = CS + 0x130;
  SolveLinearSystem((MatrixNd *)pCVar1,(VectorNd *)&local_120,(VectorNd *)pCVar13,
                    *(LinearSolver *)CS);
  free(local_120.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  uVar5 = *(ulong *)(CS + 0x138);
  if (0 < (long)uVar5) {
    lVar17 = *(long *)pCVar13;
    uVar16 = 0;
    do {
      *(ulong *)(lVar17 + uVar16 * 8) = *(ulong *)(lVar17 + uVar16 * 8) ^ 0x8000000000000000;
      uVar16 = uVar16 + 1;
    } while ((uVar16 & 0xffffffff) < uVar5);
  }
  local_b8._0_8_ = local_100;
  local_a8.m_matrix = (non_const_type)local_f8;
  local_b8._8_8_ = pCVar12;
  local_a0 = pCVar18;
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const>>
            ((Matrix<double,_1,1,0,_1,1> *)&local_120,
             (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
              *)local_b8);
  pPVar10 = local_c8;
  pdVar9 = local_120.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data;
  pVVar19 = (VectorNd *)
            local_120.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_rows;
  if ((VectorNd *)(local_c8->m_storage).m_rows !=
      (VectorNd *)
      local_120.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (local_c8,local_120.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                        m_storage.m_rows,1);
    pVVar19 = (VectorNd *)(pPVar10->m_storage).m_rows;
  }
  pdVar6 = (pPVar10->m_storage).m_data;
  pVVar14 = (VectorNd *)((long)pVVar19 - ((long)pVVar19 >> 0x3f) & 0xfffffffffffffffe);
  if (1 < (long)pVVar19) {
    lVar17 = 0;
    do {
      pCVar1 = (ConstraintSet *)((long)pdVar9 + lVar17 * 8);
      dVar8 = *(double *)(pCVar1 + 8);
      pdVar4 = pdVar6 + lVar17;
      *pdVar4 = *(double *)pCVar1;
      pdVar4[1] = dVar8;
      lVar17 = lVar17 + 2;
    } while (lVar17 < (long)pVVar14);
  }
  if ((long)pVVar14 < (long)pVVar19) {
    do {
      pdVar6[(long)pVVar14] = *(double *)((long)pdVar9 + (long)pVVar14 * 8);
      pVVar14 = (VectorNd *)
                ((long)&(pVVar14->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                        m_storage.m_data + 1);
    } while (pVVar19 != pVVar14);
  }
  free(local_120.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  local_b8._0_8_ = local_100;
  local_a0 = local_100;
  local_90 = local_108;
  local_80 = local_d0;
  local_70 = local_d8;
  local_58 = local_f0;
  local_78 = pCVar12;
  local_68 = pCVar18;
  local_50 = pCVar13;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>const>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const>const,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const>const>,0>,Eigen::internal::assign_op<double,double>>
            (TauOutput,
             (Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>_>,_0>
              *)local_b8,(assign_op<double,_double> *)&local_120,(type)0x0);
  return;
}

Assistant:

RBDL_DLLAPI
void InverseDynamicsConstraints(
  Model &model,
  const Math::VectorNd &Q,
  const Math::VectorNd &QDot,
  const Math::VectorNd &QDDotDesired,
  ConstraintSet &CS,
  Math::VectorNd &QDDotOutput,
  Math::VectorNd &TauOutput,
  bool update_kinematics,
  std::vector<Math::SpatialVector> *f_ext)
{

  LOG << "-------- " << __func__ << " ------" << std::endl;

  assert (QDot.size()         == QDDotDesired.size());
  assert (QDDotDesired.size() == QDot.size());
  assert (QDDotOutput.size()  == QDot.size());
  assert (TauOutput.size()    == CS.H.rows());

  assert (CS.S.cols()     == QDDotDesired.rows());

  unsigned int n  = unsigned(    CS.H.rows());
  unsigned int nc = unsigned( CS.name.size());
  unsigned int na = unsigned(    CS.S.rows());
  unsigned int nu = n-na;

  TauOutput.setZero();
  CalcConstrainedSystemVariables(model,Q,QDot,TauOutput,CS,update_kinematics,
                                f_ext);

  // This implementation follows the projected KKT system described in
  // Eqn. 5.20 of Henning Koch's thesis work. Note that this will fail
  // for under actuated systems
  //  [ SMS'      SMP'    SJ'    I][      u]   [ -SC    ]
  //  [ PMS'      PMP'    PJ'     ][      v] = [ -PC    ]
  //  [ JS'        JP'     0      ][-lambda]   [ -gamma ]
  //  [ I                         ][   -tau]   [  v*     ]
  //double alpha = 0.1;

  CS.Ful = CS.S*CS.H*CS.S.transpose();
  CS.Fur = CS.S*CS.H*CS.P.transpose();
  CS.Fll = CS.P*CS.H*CS.S.transpose();
  CS.Flr = CS.P*CS.H*CS.P.transpose();

  CS.GTu = CS.S*(CS.G.transpose());
  CS.GTl = CS.P*(CS.G.transpose());

  //Exploiting the block triangular structure
  //u:
  //I u = S*qdd*
  CS.u = CS.S*QDDotDesired;
  // v
  //(JP')v = -gamma - (JS')u
  //Using GT

  //This fails using SimpleMath and I'm not sure how to fix it
  SolveLinearSystem( CS.GTl.transpose(),
                     CS.gamma - CS.GTu.transpose()*CS.u,
                     CS.v, CS.linear_solver);

  // lambda
  SolveLinearSystem(CS.GTl,
                    -CS.P*CS.C
                    - CS.Fll*CS.u
                    - CS.Flr*CS.v,
                    CS.force,
                    CS.linear_solver);

  for(unsigned int i=0; i<CS.force.rows(); ++i) {
    CS.force[i] *= -1.0;
  }

  //Evaluating qdd
  QDDotOutput = CS.S.transpose()*CS.u + CS.P.transpose()*CS.v;

  //Evaluating tau
  TauOutput = -CS.S.transpose()*( -CS.S*CS.C
                                  -( CS.Ful*CS.u
                                     +CS.Fur*CS.v
                                     -CS.GTu*CS.force));




}